

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

mi_page_t * mi_find_free_page(mi_heap_t *heap,size_t size)

{
  _Bool _Var1;
  mi_page_queue_t *pmVar2;
  mi_page_t *pmVar3;
  undefined8 in_RSI;
  undefined1 force;
  mi_page_t *in_RDI;
  mi_page_t *page;
  mi_page_queue_t *pq;
  size_t in_stack_ffffffffffffffd8;
  mi_heap_t *in_stack_ffffffffffffffe0;
  
  force = (undefined1)((ulong)in_RSI >> 0x38);
  pmVar2 = mi_page_queue(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar3 = pmVar2->first;
  if (pmVar3 != (mi_page_t *)0x0) {
    _mi_page_free_collect(in_RDI,(_Bool)force);
    _Var1 = mi_page_immediate_available(pmVar3);
    if (_Var1) {
      pmVar3->field_0xf = pmVar3->field_0xf & 1;
      return pmVar3;
    }
  }
  pmVar3 = mi_page_queue_find_free_ex((mi_heap_t *)size,pq,page._7_1_);
  return pmVar3;
}

Assistant:

static inline mi_page_t* mi_find_free_page(mi_heap_t* heap, size_t size) {
  mi_page_queue_t* pq = mi_page_queue(heap, size);

  // check the first page: we even do this with candidate search or otherwise we re-search every time
  mi_page_t* page = pq->first;
  if (page != NULL) {
   #if (MI_SECURE>=3) // in secure mode, we extend half the time to increase randomness
    if (page->capacity < page->reserved && ((_mi_heap_random_next(heap) & 1) == 1)) {
      mi_page_extend_free(heap, page, heap->tld);
      mi_assert_internal(mi_page_immediate_available(page));
    }
    else
   #endif
    {
      _mi_page_free_collect(page,false);
    }

    if (mi_page_immediate_available(page)) {
      page->retire_expire = 0;
      return page; // fast path
    }
  }

  return mi_page_queue_find_free_ex(heap, pq, true);
}